

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O0

void __thiscall
duckdb::
PrimitiveDictionary<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
::Insert(PrimitiveDictionary<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
         *this,interval_t value)

{
  long lVar1;
  bool bVar2;
  primitive_dictionary_entry_t *this_00;
  interval_t *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  PrimitiveDictionary<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
  *unaff_retaddr;
  primitive_dictionary_entry_t *entry;
  PrimitiveDictionary<duckdb::interval_t,_duckdb::ParquetIntervalTargetType,_duckdb::ParquetIntervalOperator>
  *in_stack_00000028;
  
  if ((*(byte *)(in_RDI + 0x98) & 1) == 0) {
    this_00 = Lookup(unaff_retaddr,in_RDX);
    bVar2 = primitive_dictionary_entry_t::IsEmpty(this_00);
    if (bVar2) {
      if ((*(ulong *)(in_RDI + 8) < *(long *)(in_RDI + 0x10) + 1U) ||
         (bVar2 = AddToTarget<duckdb::interval_t,_0>(in_stack_00000028,(interval_t *)value.micros),
         !bVar2)) {
        *(undefined1 *)(in_RDI + 0x98) = 1;
      }
      else {
        (this_00->value).months = (int)in_RSI;
        (this_00->value).days = (int)((ulong)in_RSI >> 0x20);
        (this_00->value).micros = (int64_t)in_RDX;
        lVar1 = *(long *)(in_RDI + 0x10);
        *(long *)(in_RDI + 0x10) = lVar1 + 1;
        this_00->index = (uint32_t)lVar1;
      }
    }
  }
  return;
}

Assistant:

void Insert(SRC value) {
		if (full) {
			return;
		}
		auto &entry = Lookup(value);
		if (entry.IsEmpty()) {
			if (size + 1 > maximum_size || !AddToTarget(value)) {
				full = true;
				return;
			}
			entry.value = value;
			entry.index = size++;
		}
	}